

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

int __thiscall
lossless_neural_sound::expression_compiler::expression::
Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>::
structurally_compare_tree
          (Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum> *this,
          Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum> *rt)

{
  int iVar1;
  uint uVar2;
  Expression_node *this_00;
  Expression_node *rt_00;
  Leaf_iterator right_iterator;
  Leaf_iterator left_iterator;
  
  if (rt == (Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum> *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x3b9,
                  "int lossless_neural_sound::expression_compiler::expression::Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>::structurally_compare_tree(const Balanced_tree<Derived_class> *) const [Derived_class = lossless_neural_sound::expression_compiler::expression::Sum]"
                 );
  }
  Leaf_iterator::Leaf_iterator(&left_iterator,this);
  Leaf_iterator::Leaf_iterator(&right_iterator,rt);
  while ((left_iterator.stack.stack_top != 0x41 && (right_iterator.stack.stack_top != 0x41))) {
    this_00 = Leaf_iterator::operator*(&left_iterator);
    rt_00 = Leaf_iterator::operator*(&right_iterator);
    iVar1 = Expression_node::structurally_compare(this_00,rt_00);
    if (iVar1 != 0) {
      return iVar1;
    }
    Leaf_iterator::operator++(&left_iterator);
    Leaf_iterator::operator++(&right_iterator);
  }
  if (left_iterator.stack.stack_top == 0x41 && right_iterator.stack.stack_top != 0x41) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = (uint)(left_iterator.stack.stack_top != 0x41 && right_iterator.stack.stack_top == 0x41);
  }
  return uVar2;
}

Assistant:

int structurally_compare_tree(const Balanced_tree *rt) const noexcept
    {
        assert(rt);
        auto left_iterator = Leaf_iterator(this);
        auto right_iterator = Leaf_iterator(rt);
        for(; left_iterator != Leaf_iterator() && right_iterator != Leaf_iterator();
            ++left_iterator, ++right_iterator)
        {
            int compare_result = (*left_iterator)->structurally_compare(*right_iterator);
            if(compare_result != 0)
                return compare_result;
        }
        bool left_at_end = left_iterator == Leaf_iterator();
        bool right_at_end = right_iterator == Leaf_iterator();
        if(left_at_end && !right_at_end)
            return -1;
        if(!left_at_end && right_at_end)
            return 1;
        return 0;
    }